

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_Env<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  FrameDisplay *pFVar5;
  undefined4 *puVar6;
  
  RVar4 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88));
  if (RVar4 == 0xffffffff) {
    pFVar5 = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  else {
    pFVar5 = GetLocalFrameDisplay(this);
  }
  uVar1 = playout->Arg;
  if (*(ulong *)(this + 0x30) <= (ulong)((uint)uVar1 * 8) + *(long *)(this + 0x28)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x93a,"(m_outParams + outRegisterID < m_outSp)",
                                "m_outParams + outRegisterID < m_outSp");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  *(FrameDisplay **)(*(long *)(this + 0x28) + (ulong)uVar1 * 8) = pFVar5;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_Env(const unaligned T * playout)
    {
        Var argEnv;
        if (this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        else
        {
            argEnv = this->LdEnv();
        }
        SetOut(playout->Arg, argEnv);
    }